

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SGDOptimizer::SerializeWithCachedSizes
          (SGDOptimizer *this,CodedOutputStream *output)

{
  if (this->learningrate_ != (DoubleParameter *)0x0 &&
      this != (SGDOptimizer *)&_SGDOptimizer_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->learningrate_->super_MessageLite,output);
  }
  if (this->minibatchsize_ != (Int64Parameter *)0x0 &&
      this != (SGDOptimizer *)&_SGDOptimizer_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->minibatchsize_->super_MessageLite,output);
  }
  if (this->momentum_ != (DoubleParameter *)0x0 &&
      this != (SGDOptimizer *)&_SGDOptimizer_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->momentum_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void SGDOptimizer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SGDOptimizer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.DoubleParameter learningRate = 1;
  if (this->has_learningrate()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->learningrate_, output);
  }

  // .CoreML.Specification.Int64Parameter miniBatchSize = 2;
  if (this->has_minibatchsize()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->minibatchsize_, output);
  }

  // .CoreML.Specification.DoubleParameter momentum = 3;
  if (this->has_momentum()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->momentum_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SGDOptimizer)
}